

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3ExprAnd(sqlite3 *db,Expr *pLeft,Expr *pRight)

{
  int iVar1;
  Expr *pEVar2;
  
  pEVar2 = pRight;
  if ((pLeft != (Expr *)0x0) && (pEVar2 = pLeft, pRight != (Expr *)0x0)) {
    iVar1 = exprAlwaysFalse(pLeft);
    if ((iVar1 != 0) || (iVar1 = exprAlwaysFalse(pRight), iVar1 != 0)) {
      sqlite3ExprDeleteNN(db,pLeft);
      sqlite3ExprDeleteNN(db,pRight);
      pEVar2 = sqlite3ExprAlloc(db,0x8f,sqlite3IntTokens,0);
      return pEVar2;
    }
    pEVar2 = sqlite3ExprAlloc(db,0x2c,(Token *)0x0,0);
    sqlite3ExprAttachSubtrees(db,pEVar2,pLeft,pRight);
  }
  return pEVar2;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(sqlite3 *db, Expr *pLeft, Expr *pRight){
  if( pLeft==0 ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else if( exprAlwaysFalse(pLeft) || exprAlwaysFalse(pRight) ){
    sqlite3ExprDelete(db, pLeft);
    sqlite3ExprDelete(db, pRight);
    return sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0);
  }else{
    Expr *pNew = sqlite3ExprAlloc(db, TK_AND, 0, 0);
    sqlite3ExprAttachSubtrees(db, pNew, pLeft, pRight);
    return pNew;
  }
}